

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InlineOpaquePass::IsOpaqueType(InlineOpaquePass *this,uint32_t typeId)

{
  Op OVar1;
  IRContext *this_00;
  pointer pOVar2;
  uint **ppuVar3;
  bool bVar4;
  char cVar5;
  Instruction *this_01;
  uint **ppuVar6;
  uint uVar7;
  pointer pOVar8;
  InlineOpaquePass *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  uint *local_30;
  
  while( true ) {
    this_00 = (this->super_InlinePass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = analysis::DefUseManager::GetDef
                        ((this_00->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,typeId);
    OVar1 = this_01->opcode_;
    if (OVar1 != OpTypePointer) break;
    uVar7 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar7 = (uint)this_01->has_result_id_;
    }
    typeId = Instruction::GetSingleWordOperand(this_01,uVar7 + 1);
  }
  if (OVar1 - OpTypeImage < 3) {
    bVar4 = true;
  }
  else if (OVar1 == OpTypeStruct) {
    local_48 = 0;
    local_38 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:43:35)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:43:35)>
               ::_M_manager;
    pOVar8 = (this_01->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pOVar2 = (this_01->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_50 = this;
    if (pOVar8 == pOVar2) {
      bVar4 = false;
    }
    else {
      do {
        bVar4 = spvIsInIdType(pOVar8->type);
        if (bVar4) {
          ppuVar3 = (uint **)(pOVar8->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar6 = &(pOVar8->words).small_data_;
          if (ppuVar3 != (uint **)0x0) {
            ppuVar6 = ppuVar3;
          }
          local_30 = *ppuVar6;
          if (local_40 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar5 = (*local_38)(&local_50,&local_30);
          if (cVar5 == '\0') {
            bVar4 = true;
            goto LAB_0021bdb7;
          }
        }
        pOVar8 = pOVar8 + 1;
      } while (pOVar8 != pOVar2);
      bVar4 = false;
LAB_0021bdb7:
      if (local_40 == (code *)0x0) {
        return bVar4;
      }
    }
    (*local_40)(&local_50,&local_50,3);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool InlineOpaquePass::IsOpaqueType(uint32_t typeId) {
  const Instruction* typeInst = get_def_use_mgr()->GetDef(typeId);
  switch (typeInst->opcode()) {
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
      return true;
    case spv::Op::OpTypePointer:
      return IsOpaqueType(
          typeInst->GetSingleWordInOperand(kTypePointerTypeIdInIdx));
    default:
      break;
  }
  // TODO(greg-lunarg): Handle arrays containing opaque type
  if (typeInst->opcode() != spv::Op::OpTypeStruct) return false;
  // Return true if any member is opaque
  return !typeInst->WhileEachInId([this](const uint32_t* tid) {
    if (IsOpaqueType(*tid)) return false;
    return true;
  });
}